

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::ZoneVector<asmjit::v1_14::RAWorkReg_*>::concat
          (ZoneVector<asmjit::v1_14::RAWorkReg_*> *this,ZoneAllocator *allocator,
          ZoneVector<asmjit::v1_14::RAWorkReg_*> *other)

{
  uint uVar1;
  undefined8 *in_RDX;
  ZoneVector<asmjit::v1_14::RAWorkReg_*> *in_RDI;
  Error _err;
  uint32_t size;
  ZoneAllocator *in_stack_ffffffffffffffc8;
  Error local_4;
  
  uVar1 = *(uint *)(in_RDX + 1);
  if ((uVar1 <= (uint)(*(int *)(in_RDI + 0xc) - *(int *)(in_RDI + 8))) ||
     (local_4 = grow(in_RDI,in_stack_ffffffffffffffc8,0), local_4 == 0)) {
    if (uVar1 != 0) {
      memcpy((void *)(*(long *)in_RDI + (ulong)*(uint *)(in_RDI + 8) * 8),(void *)*in_RDX,
             (ulong)uVar1 << 3);
      *(uint *)(in_RDI + 8) = uVar1 + *(int *)(in_RDI + 8);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ASMJIT_FORCE_INLINE Error concat(ZoneAllocator* allocator, const ZoneVector<T>& other) noexcept {
    uint32_t size = other._size;
    if (_capacity - _size < size)
      ASMJIT_PROPAGATE(grow(allocator, size));

    if (size) {
      memcpy(static_cast<void*>(static_cast<T*>(_data) + _size),
             static_cast<const void*>(other._data),
             size_t(size) * sizeof(T));
      _size += size;
    }

    return kErrorOk;
  }